

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O0

void __thiscall amrex::AmrLevel::writePlotFile(AmrLevel *this,string *dir,ostream *os,How how)

{
  Real RVar1;
  pointer pFVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  CoordType CVar8;
  int iVar9;
  int iVar10;
  StateDescriptor *pSVar11;
  size_type sVar12;
  IndexSpace *pIVar13;
  string *psVar14;
  Geometry *pGVar15;
  Real *pRVar16;
  ulong uVar17;
  char *pcVar18;
  ostream *poVar19;
  Long LVar20;
  long lVar21;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  reference pvVar22;
  DeriveRec *this_01;
  ostream *in_RDX;
  string *in_RSI;
  AmrLevel *in_RDI;
  bool bVar23;
  IntVect IVar24;
  string TheFullPath;
  EBFArrayBoxFactory *factory;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dname_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  int comp_2;
  int typ_2;
  MultiFab *this_dat;
  MultiFab plotMF;
  int nGrow;
  int cnt;
  int lev;
  string PathNameInHeader;
  RealBox gridloc;
  string FullPath;
  string sLevel;
  char buf [64];
  int k;
  int f_lev;
  DeriveRec *rec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dname;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  int comp_1;
  int typ_1;
  Real cur_time;
  int n_data_items;
  DeriveRec *d;
  const_iterator __end1;
  const_iterator __begin1;
  list<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_> *__range1;
  list<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_> *dlist;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  derive_names;
  int num_derive;
  int comp;
  int typ;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> plot_var_map;
  int n;
  int i;
  undefined1 in_stack_00000903;
  How in_stack_00000904;
  string *in_stack_00000908;
  FabArray<amrex::FArrayBox> *in_stack_00000910;
  value_type *in_stack_fffffffffffff998;
  undefined4 in_stack_fffffffffffff9a0;
  int in_stack_fffffffffffff9a4;
  DeriveRec *in_stack_fffffffffffff9a8;
  AmrMesh *in_stack_fffffffffffff9b0;
  int in_stack_fffffffffffff9b8;
  undefined4 in_stack_fffffffffffff9bc;
  StateData *in_stack_fffffffffffff9c0;
  MFInfo *info;
  Box *in_stack_fffffffffffff9c8;
  DistributionMapping *src;
  undefined4 in_stack_fffffffffffff9d0;
  undefined4 in_stack_fffffffffffff9d4;
  string *in_stack_fffffffffffff9d8;
  BoxArray *bxs;
  int in_stack_fffffffffffff9e0;
  int in_stack_fffffffffffff9e4;
  ostream *in_stack_fffffffffffff9f0;
  string local_470 [39];
  reference in_stack_fffffffffffffbb8;
  iterator in_stack_fffffffffffffbc0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_438;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_430;
  int local_428;
  int local_424;
  MultiFab *local_420;
  BoxArray local_418 [4];
  undefined4 local_26c;
  uint local_268;
  int local_264;
  string local_260 [64];
  RealBox local_220;
  string local_1f0 [39];
  allocator local_1c9;
  string local_1c8 [32];
  char local_1a8 [75];
  allocator local_15d;
  int local_15c;
  int local_158 [3];
  IntVect local_148;
  int local_13c;
  DeriveRec *local_138;
  reference local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_118;
  int local_110;
  int local_10c;
  string local_108 [32];
  Real local_e8;
  int local_dc;
  reference local_d8;
  _Self local_d0;
  _Self local_c8;
  list<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_> *local_c0;
  list<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_> *local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  int local_98;
  pair<int,_int> local_94;
  undefined1 local_8c [20];
  int local_78;
  int local_74;
  undefined1 local_70 [84];
  IndexType local_1c;
  char *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  local_70._40_8_ = in_RDX;
  local_70._48_8_ = in_RSI;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x10f6863);
  for (local_74 = 0; iVar9 = local_74, iVar7 = DescriptorList::size((DescriptorList *)0x10f6888),
      iVar9 < iVar7; local_74 = local_74 + 1) {
    local_78 = 0;
    while( true ) {
      iVar9 = local_78;
      pSVar11 = DescriptorList::operator[]
                          ((DescriptorList *)
                           CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                           (int)((ulong)in_stack_fffffffffffff998 >> 0x20));
      iVar7 = StateDescriptor::nComp(pSVar11);
      if (iVar7 <= iVar9) break;
      DescriptorList::operator[]
                ((DescriptorList *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                 (int)((ulong)in_stack_fffffffffffff998 >> 0x20));
      StateDescriptor::name_abi_cxx11_
                ((StateDescriptor *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                 (int)((ulong)in_stack_fffffffffffff998 >> 0x20));
      bVar6 = Amr::isStatePlotVar((string *)
                                  CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
      bVar23 = false;
      if (bVar6) {
        pSVar11 = DescriptorList::operator[]
                            ((DescriptorList *)
                             CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                             (int)((ulong)in_stack_fffffffffffff998 >> 0x20));
        local_8c._4_4_ = StateDescriptor::getType(pSVar11);
        IndexType::IndexType(&local_1c,CELL,CELL,CELL);
        local_8c._0_4_ = local_1c.itype;
        local_70._72_8_ = local_8c + 4;
        local_70._64_8_ = local_8c;
        bVar23 = local_1c.itype == local_8c._4_4_;
      }
      if (bVar23) {
        std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_94,&local_74,&local_78);
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                   CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                   in_stack_fffffffffffff998);
      }
      local_78 = local_78 + 1;
    }
  }
  local_98 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x10f6a52);
  local_c0 = DeriveList::dlist_abi_cxx11_((DeriveList *)derive_lst);
  local_b8 = local_c0;
  local_c8._M_node =
       (_List_node_base *)
       std::__cxx11::list<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_>::begin
                 ((list<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_> *)
                  in_stack_fffffffffffff998);
  local_d0._M_node =
       (_List_node_base *)
       std::__cxx11::list<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_>::end
                 ((list<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_> *)
                  in_stack_fffffffffffff998);
  while (bVar23 = std::operator!=(&local_c8,&local_d0), bVar23) {
    local_d8 = std::_List_const_iterator<amrex::DeriveRec>::operator*
                         ((_List_const_iterator<amrex::DeriveRec> *)
                          CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0));
    DeriveRec::name_abi_cxx11_(local_d8);
    bVar23 = Amr::isDerivePlotVar
                       ((string *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
    if (bVar23) {
      DeriveRec::name_abi_cxx11_(local_d8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff9b0,(value_type *)in_stack_fffffffffffff9a8);
      iVar9 = DeriveRec::numDerive(local_d8);
      local_98 = iVar9 + local_98;
    }
    std::_List_const_iterator<amrex::DeriveRec>::operator++(&local_c8);
  }
  sVar12 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_70
                     );
  local_dc = (int)sVar12 + local_98;
  pIVar13 = EB2::TopIndexSpaceIfPresent();
  if (pIVar13 != (IndexSpace *)0x0) {
    local_dc = local_dc + 1;
  }
  Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
            ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
             CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
             (size_type)in_stack_fffffffffffff998);
  local_e8 = StateData::curTime(in_stack_fffffffffffff9c0);
  if ((in_RDI->level == 0) &&
     (bVar23 = ParallelDescriptor::IOProcessor(), uVar5 = local_70._40_8_, bVar23)) {
    (*in_RDI->_vptr_AmrLevel[3])(local_108);
    poVar19 = std::operator<<((ostream *)uVar5,local_108);
    std::operator<<(poVar19,'\n');
    std::__cxx11::string::~string(local_108);
    if (local_dc == 0) {
      local_18 = "Must specify at least one valid data item to plot";
      Error_host((char *)in_stack_fffffffffffff9b0);
    }
    poVar19 = (ostream *)std::ostream::operator<<((void *)local_70._40_8_,local_dc);
    std::operator<<(poVar19,'\n');
    for (local_70._32_4_ = 0; uVar4 = local_70._32_4_,
        sVar12 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                           ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                            local_70), (int)uVar4 < (int)sVar12;
        local_70._32_4_ = local_70._32_4_ + 1) {
      pvVar22 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                          ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                           local_70,(long)(int)local_70._32_4_);
      local_10c = pvVar22->first;
      pvVar22 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                          ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                           local_70,(long)(int)local_70._32_4_);
      uVar5 = local_70._40_8_;
      local_110 = pvVar22->second;
      DescriptorList::operator[]
                ((DescriptorList *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                 (int)((ulong)in_stack_fffffffffffff998 >> 0x20));
      psVar14 = StateDescriptor::name_abi_cxx11_
                          ((StateDescriptor *)
                           CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                           (int)((ulong)in_stack_fffffffffffff998 >> 0x20));
      poVar19 = std::operator<<((ostream *)uVar5,(string *)psVar14);
      std::operator<<(poVar19,'\n');
    }
    local_118 = &local_b0;
    local_120._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff998);
    local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff998);
    while (bVar23 = __gnu_cxx::operator!=
                              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)in_stack_fffffffffffff998), bVar23) {
      local_130 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_120);
      local_138 = DeriveList::get((DeriveList *)
                                  CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8),
                                  (string *)in_stack_fffffffffffff9b0);
      for (local_70._32_4_ = 0; uVar4 = local_70._32_4_, iVar9 = DeriveRec::numDerive(local_138),
          uVar5 = local_70._40_8_, (int)uVar4 < iVar9; local_70._32_4_ = local_70._32_4_ + 1) {
        psVar14 = DeriveRec::variableName_abi_cxx11_
                            (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a4);
        poVar19 = std::operator<<((ostream *)uVar5,(string *)psVar14);
        std::operator<<(poVar19,'\n');
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_120);
    }
    pIVar13 = EB2::TopIndexSpaceIfPresent();
    if (pIVar13 != (IndexSpace *)0x0) {
      std::operator<<((ostream *)local_70._40_8_,"vfrac\n");
    }
    poVar19 = (ostream *)std::ostream::operator<<((void *)local_70._40_8_,3);
    std::operator<<(poVar19,'\n');
    uVar5 = local_70._40_8_;
    RVar1 = Amr::cumTime(in_RDI->parent);
    poVar19 = (ostream *)std::ostream::operator<<((void *)uVar5,RVar1);
    std::operator<<(poVar19,'\n');
    local_13c = AmrMesh::finestLevel((AmrMesh *)in_RDI->parent);
    poVar19 = (ostream *)std::ostream::operator<<((void *)local_70._40_8_,local_13c);
    std::operator<<(poVar19,'\n');
    for (local_70._32_4_ = 0; uVar5 = local_70._40_8_, (int)local_70._32_4_ < 3;
        local_70._32_4_ = local_70._32_4_ + 1) {
      Geom(in_RDI);
      RVar1 = Geometry::ProbLo((Geometry *)
                               CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                               (int)((ulong)in_stack_fffffffffffff998 >> 0x20));
      poVar19 = (ostream *)std::ostream::operator<<((void *)uVar5,RVar1);
      std::operator<<(poVar19,' ');
    }
    std::operator<<((ostream *)local_70._40_8_,'\n');
    for (local_70._32_4_ = 0; uVar5 = local_70._40_8_, (int)local_70._32_4_ < 3;
        local_70._32_4_ = local_70._32_4_ + 1) {
      Geom(in_RDI);
      RVar1 = Geometry::ProbHi((Geometry *)
                               CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                               (int)((ulong)in_stack_fffffffffffff998 >> 0x20));
      poVar19 = (ostream *)std::ostream::operator<<((void *)uVar5,RVar1);
      std::operator<<(poVar19,' ');
    }
    std::operator<<((ostream *)local_70._40_8_,'\n');
    for (local_70._32_4_ = 0; uVar5 = local_70._40_8_, (int)local_70._32_4_ < local_13c;
        local_70._32_4_ = local_70._32_4_ + 1) {
      IVar24 = AmrMesh::refRatio(in_stack_fffffffffffff9b0,
                                 (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
      local_158[2] = IVar24.vect[2];
      local_148.vect[2] = local_158[2];
      local_158._0_8_ = IVar24.vect._0_8_;
      local_148.vect[0] = local_158[0];
      local_148.vect[1] = local_158[1];
      uVar3 = local_148.vect._0_8_;
      local_8 = &local_148;
      local_c = 0;
      local_148.vect[0] = IVar24.vect[0];
      iVar9 = local_148.vect[0];
      local_158 = IVar24.vect;
      local_148.vect._0_8_ = uVar3;
      poVar19 = (ostream *)std::ostream::operator<<((void *)uVar5,iVar9);
      std::operator<<(poVar19,' ');
    }
    std::operator<<((ostream *)local_70._40_8_,'\n');
    for (local_70._32_4_ = 0; (int)local_70._32_4_ <= local_13c;
        local_70._32_4_ = local_70._32_4_ + 1) {
      pGVar15 = AmrMesh::Geom((AmrMesh *)
                              CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                              (int)((ulong)in_stack_fffffffffffff998 >> 0x20));
      Geometry::Domain(pGVar15);
      poVar19 = amrex::operator<<((ostream *)in_stack_fffffffffffff9d8,
                                  (Box *)CONCAT44(in_stack_fffffffffffff9d4,
                                                  in_stack_fffffffffffff9d0));
      std::operator<<(poVar19,' ');
    }
    std::operator<<((ostream *)local_70._40_8_,'\n');
    for (local_70._32_4_ = 0; uVar5 = local_70._40_8_, (int)local_70._32_4_ <= local_13c;
        local_70._32_4_ = local_70._32_4_ + 1) {
      iVar9 = Amr::levelSteps((Amr *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                              (int)((ulong)in_stack_fffffffffffff998 >> 0x20));
      poVar19 = (ostream *)std::ostream::operator<<((void *)uVar5,iVar9);
      std::operator<<(poVar19,' ');
    }
    std::operator<<((ostream *)local_70._40_8_,'\n');
    for (local_70._32_4_ = 0; uVar5 = local_70._40_8_, (int)local_70._32_4_ <= local_13c;
        local_70._32_4_ = local_70._32_4_ + 1) {
      for (local_15c = 0; uVar5 = local_70._40_8_, local_15c < 3; local_15c = local_15c + 1) {
        pGVar15 = AmrMesh::Geom((AmrMesh *)
                                CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                                (int)((ulong)in_stack_fffffffffffff998 >> 0x20));
        pRVar16 = CoordSys::CellSize(&pGVar15->super_CoordSys);
        poVar19 = (ostream *)std::ostream::operator<<((void *)uVar5,pRVar16[local_15c]);
        std::operator<<(poVar19,' ');
      }
      std::operator<<((ostream *)local_70._40_8_,'\n');
    }
    pGVar15 = Geom(in_RDI);
    CVar8 = CoordSys::Coord(&pGVar15->super_CoordSys);
    poVar19 = (ostream *)std::ostream::operator<<((void *)uVar5,CVar8);
    std::operator<<(poVar19,'\n');
    std::operator<<((ostream *)local_70._40_8_,"0\n");
  }
  if ((writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)::
       BaseName_abi_cxx11_ == '\0') &&
     (iVar9 = __cxa_guard_acquire(&writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)
                                   ::BaseName_abi_cxx11_), iVar9 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               &writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)::
                BaseName_abi_cxx11_,"/Cell",&local_15d);
    std::allocator<char>::~allocator((allocator<char> *)&local_15d);
    __cxa_atexit(std::__cxx11::string::~string,
                 &writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)::
                  BaseName_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)
                         ::BaseName_abi_cxx11_);
  }
  sprintf(local_1a8,"Level_%d",(ulong)(uint)in_RDI->level);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c8,local_1a8,&local_1c9);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  std::__cxx11::string::string(local_1f0,(string *)local_70._48_8_);
  uVar17 = std::__cxx11::string::empty();
  if ((uVar17 & 1) == 0) {
    std::__cxx11::string::size();
    pcVar18 = (char *)std::__cxx11::string::operator[]((ulong)local_1f0);
    if (*pcVar18 != '/') {
      std::__cxx11::string::operator+=(local_1f0,'/');
    }
  }
  std::__cxx11::string::operator+=(local_1f0,local_1c8);
  if ((in_RDI->levelDirectoryCreated & 1U) == 0) {
    bVar23 = ParallelDescriptor::IOProcessor();
    if ((bVar23) &&
       (bVar23 = UtilCreateDirectory((string *)
                                     CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                                     (mode_t)((ulong)in_stack_fffffffffffff998 >> 0x20),
                                     SUB81((ulong)in_stack_fffffffffffff998 >> 0x18,0)), !bVar23)) {
      CreateDirectoryFailed(in_stack_fffffffffffff9d8);
    }
    ParallelDescriptor::Barrier((string *)ParallelDescriptor::Unnamed_abi_cxx11_);
  }
  iVar9 = (int)((ulong)in_stack_fffffffffffff998 >> 0x20);
  bVar23 = ParallelDescriptor::IOProcessor();
  if (bVar23) {
    poVar19 = (ostream *)std::ostream::operator<<((void *)local_70._40_8_,in_RDI->level);
    poVar19 = std::operator<<(poVar19,' ');
    LVar20 = BoxArray::size((BoxArray *)0x10f77a5);
    poVar19 = (ostream *)std::ostream::operator<<(poVar19,LVar20);
    poVar19 = std::operator<<(poVar19,' ');
    poVar19 = (ostream *)std::ostream::operator<<(poVar19,local_e8);
    std::operator<<(poVar19,'\n');
    uVar5 = local_70._40_8_;
    iVar9 = Amr::levelSteps((Amr *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                            iVar9);
    poVar19 = (ostream *)std::ostream::operator<<((void *)uVar5,iVar9);
    std::operator<<(poVar19,'\n');
    for (local_70._32_4_ = 0; lVar21 = (long)(int)local_70._32_4_,
        LVar20 = BoxArray::size((BoxArray *)0x10f7892), lVar21 < LVar20;
        local_70._32_4_ = local_70._32_4_ + 1) {
      BoxArray::operator[]
                ((BoxArray *)in_stack_fffffffffffff9b0,
                 (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
      CoordSys::CellSize(&(in_RDI->geom).super_CoordSys);
      Geometry::ProbLo((Geometry *)0x10f78f0);
      RealBox::RealBox((RealBox *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                       in_stack_fffffffffffff9c8,(Real *)in_stack_fffffffffffff9c0,
                       (Real *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
      for (local_70._28_4_ = 0; uVar5 = local_70._40_8_, (int)local_70._28_4_ < 3;
          local_70._28_4_ = local_70._28_4_ + 1) {
        RVar1 = RealBox::lo(&local_220,local_70._28_4_);
        poVar19 = (ostream *)std::ostream::operator<<((void *)uVar5,RVar1);
        poVar19 = std::operator<<(poVar19,' ');
        RVar1 = RealBox::hi(&local_220,local_70._28_4_);
        in_stack_fffffffffffff9f0 = (ostream *)std::ostream::operator<<(poVar19,RVar1);
        std::operator<<(in_stack_fffffffffffff9f0,'\n');
      }
    }
    if (0 < local_dc) {
      std::__cxx11::string::string(local_260,local_1c8);
      std::__cxx11::string::operator+=
                (local_260,
                 (string *)
                 &writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)::
                  BaseName_abi_cxx11_);
      poVar19 = std::operator<<((ostream *)local_70._40_8_,local_260);
      std::operator<<(poVar19,'\n');
      std::__cxx11::string::~string(local_260);
    }
    pIVar13 = EB2::TopIndexSpaceIfPresent();
    if (pIVar13 != (IndexSpace *)0x0) {
      in_stack_fffffffffffff9e4 = in_RDI->level;
      iVar9 = AmrMesh::finestLevel((AmrMesh *)in_RDI->parent);
      if (in_stack_fffffffffffff9e4 == iVar9) {
        local_264 = 0;
        while (in_stack_fffffffffffff9e0 = local_264,
              iVar9 = AmrMesh::finestLevel((AmrMesh *)in_RDI->parent),
              in_stack_fffffffffffff9e0 <= iVar9) {
          std::operator<<((ostream *)local_70._40_8_,"1.0e-6\n");
          local_264 = local_264 + 1;
        }
      }
    }
  }
  local_268 = 0;
  local_26c = 0;
  info = (MFInfo *)&in_RDI->grids;
  src = &in_RDI->dmap;
  local_418[0].m_bat.m_op._12_8_ = 0;
  local_418[0].m_bat.m_op._20_8_ = 0;
  local_418[0].m_bat._0_8_ = 0;
  local_418[0].m_bat.m_op._4_8_ = 0;
  local_418[0].m_bat.m_op._28_8_ = 0;
  bxs = local_418;
  iVar9 = local_dc;
  MFInfo::MFInfo((MFInfo *)0x10f7b7e);
  this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)Factory((AmrLevel *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0));
  MultiFab::MultiFab((MultiFab *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),bxs,
                     (DistributionMapping *)CONCAT44(iVar9,in_stack_fffffffffffff9d0),
                     (int)((ulong)src >> 0x20),(int)src,info,
                     (FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff9f0);
  MFInfo::~MFInfo((MFInfo *)0x10f7bc6);
  local_420 = (MultiFab *)0x0;
  local_70._32_4_ = 0;
  while (iVar7 = local_70._32_4_,
        sVar12 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                           ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                            local_70), iVar7 < (int)sVar12) {
    in_stack_fffffffffffff9b0 = (AmrMesh *)local_70;
    pvVar22 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                        ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         in_stack_fffffffffffff9b0,(long)(int)local_70._32_4_);
    local_424 = pvVar22->first;
    pvVar22 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                        ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         in_stack_fffffffffffff9b0,(long)(int)local_70._32_4_);
    local_428 = pvVar22->second;
    Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
              ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
               CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),(size_type)this_00);
    local_420 = StateData::newData((StateData *)
                                   CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0));
    MultiFab::Copy((MultiFab *)CONCAT44(iVar9,in_stack_fffffffffffff9d0),(MultiFab *)src,
                   (int)((ulong)info >> 0x20),(int)info,iVar7,in_stack_fffffffffffff9b8);
    local_268 = local_268 + 1;
    local_70._32_4_ = local_70._32_4_ + 1;
  }
  sVar12 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::size(&local_b0);
  if (sVar12 != 0) {
    local_430 = &local_b0;
    local_438._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(this_00);
    in_stack_fffffffffffffbc0 =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(this_00);
    while (bVar23 = __gnu_cxx::operator!=
                              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)this_00), bVar23) {
      in_stack_fffffffffffffbb8 =
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&local_438);
      (*in_RDI->_vptr_AmrLevel[0x20])
                (SUB84(local_e8,0),in_RDI,in_stack_fffffffffffffbb8,
                 (undefined1 *)((long)&local_418[0].m_bat.m_op + 0x24),(ulong)local_268);
      this_01 = DeriveList::get((DeriveList *)CONCAT44(iVar7,in_stack_fffffffffffff9b8),
                                (string *)in_stack_fffffffffffff9b0);
      iVar10 = DeriveRec::numDerive(this_01);
      local_268 = iVar10 + local_268;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_438);
    }
  }
  pIVar13 = EB2::TopIndexSpaceIfPresent();
  if (pIVar13 != (IndexSpace *)0x0) {
    FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)CONCAT44(iVar9,in_stack_fffffffffffff9d0),
               (value_type)src,(int)((ulong)info >> 0x20),(int)info,iVar7);
    register0x00000000 =
         std::
         unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
         ::get((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0));
    EBFArrayBoxFactory::getVolFrac
              ((EBFArrayBoxFactory *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0));
    MultiFab::Copy((MultiFab *)CONCAT44(iVar9,in_stack_fffffffffffff9d0),(MultiFab *)src,
                   (int)((ulong)info >> 0x20),(int)info,iVar7,in_stack_fffffffffffff9b8);
  }
  std::__cxx11::string::string(local_470,local_1f0);
  std::__cxx11::string::operator+=
            (local_470,
             (string *)
             &writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)::
              BaseName_abi_cxx11_);
  bVar23 = AsyncOut::UseAsyncOut();
  pFVar2 = stack0xfffffffffffffbb0;
  if (bVar23) {
    uVar17 = (ulong)stack0xfffffffffffffbb0 >> 0x38;
    bVar23 = SUB81(uVar17,0);
    unique0x100017e2 = pFVar2;
    VisMF::AsyncWrite((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffffbc0._M_current,
                      (string *)in_stack_fffffffffffffbb8,bVar23);
  }
  else {
    VisMF::Write(in_stack_00000910,in_stack_00000908,in_stack_00000904,(bool)in_stack_00000903);
  }
  in_RDI->levelDirectoryCreated = false;
  std::__cxx11::string::~string(local_470);
  MultiFab::~MultiFab((MultiFab *)0x10f7f50);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::string::~string(local_1c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff9b0);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             in_stack_fffffffffffff9b0);
  return;
}

Assistant:

void
AmrLevel::writePlotFile (const std::string& dir,
                         std::ostream&      os,
                         VisMF::How         how)
{
    int i, n;
    //
    // The list of indices of State to write to plotfile.
    // first component of pair is state_type,
    // second component of pair is component # within the state_type
    //
    std::vector<std::pair<int,int> > plot_var_map;
    for (int typ = 0; typ < desc_lst.size(); typ++)
    {
        for (int comp = 0; comp < desc_lst[typ].nComp();comp++)
        {
            if (parent->isStatePlotVar(desc_lst[typ].name(comp)) &&
                desc_lst[typ].getType() == IndexType::TheCellType())
            {
                plot_var_map.push_back(std::pair<int,int>(typ,comp));
            }
        }
    }

    int num_derive = 0;
    std::vector<std::string> derive_names;
    const std::list<DeriveRec>& dlist = derive_lst.dlist();
    for (auto const& d : dlist)
    {
        if (parent->isDerivePlotVar(d.name()))
        {
            derive_names.push_back(d.name());
            num_derive += d.numDerive();
        }
    }

    int n_data_items = plot_var_map.size() + num_derive;

#ifdef AMREX_USE_EB
    if (EB2::TopIndexSpaceIfPresent()) {
        n_data_items += 1;
    }
#endif

    // get the time from the first State_Type
    // if the State_Type is ::Interval, this will get t^{n+1/2} instead of t^n
    Real cur_time = state[0].curTime();

    if (level == 0 && ParallelDescriptor::IOProcessor())
    {
        //
        // The first thing we write out is the plotfile type.
        //
        os << thePlotFileType() << '\n';

        if (n_data_items == 0)
            amrex::Error("Must specify at least one valid data item to plot");

        os << n_data_items << '\n';

        //
        // Names of variables
        //
        for (i =0; i < static_cast<int>(plot_var_map.size()); i++)
        {
            int typ = plot_var_map[i].first;
            int comp = plot_var_map[i].second;
            os << desc_lst[typ].name(comp) << '\n';
        }

        // derived
        for (auto const& dname : derive_names) {
            const DeriveRec* rec = derive_lst.get(dname);
            for (i = 0; i < rec->numDerive(); ++i) {
                os << rec->variableName(i) << '\n';
            }
        }

#ifdef AMREX_USE_EB
        if (EB2::TopIndexSpaceIfPresent()) {
            os << "vfrac\n";
        }
#endif

        os << AMREX_SPACEDIM << '\n';
        os << parent->cumTime() << '\n';
        int f_lev = parent->finestLevel();
        os << f_lev << '\n';
        for (i = 0; i < AMREX_SPACEDIM; i++)
            os << Geom().ProbLo(i) << ' ';
        os << '\n';
        for (i = 0; i < AMREX_SPACEDIM; i++)
            os << Geom().ProbHi(i) << ' ';
        os << '\n';
        for (i = 0; i < f_lev; i++)
            os << parent->refRatio(i)[0] << ' ';
        os << '\n';
        for (i = 0; i <= f_lev; i++)
            os << parent->Geom(i).Domain() << ' ';
        os << '\n';
        for (i = 0; i <= f_lev; i++)
            os << parent->levelSteps(i) << ' ';
        os << '\n';
        for (i = 0; i <= f_lev; i++)
        {
            for (int k = 0; k < AMREX_SPACEDIM; k++)
                os << parent->Geom(i).CellSize()[k] << ' ';
            os << '\n';
        }
        os << (int) Geom().Coord() << '\n';
        os << "0\n"; // Write bndry data.

    }
    // Build the directory to hold the MultiFab at this level.
    // The name is relative to the directory containing the Header file.
    //
    static const std::string BaseName = "/Cell";
    char buf[64];
    sprintf(buf, "Level_%d", level);
    std::string sLevel = buf;
    //
    // Now for the full pathname of that directory.
    //
    std::string FullPath = dir;
    if ( ! FullPath.empty() && FullPath[FullPath.size()-1] != '/')
    {
        FullPath += '/';
    }
    FullPath += sLevel;
    //
    // Only the I/O processor makes the directory if it doesn't already exist.
    //
    if ( ! levelDirectoryCreated) {
        if (ParallelDescriptor::IOProcessor()) {
            if ( ! amrex::UtilCreateDirectory(FullPath, 0755)) {
                amrex::CreateDirectoryFailed(FullPath);
            }
        }
        // Force other processors to wait until directory is built.
        ParallelDescriptor::Barrier();
    }

    if (ParallelDescriptor::IOProcessor())
    {
        os << level << ' ' << grids.size() << ' ' << cur_time << '\n';
        os << parent->levelSteps(level) << '\n';

        for (i = 0; i < grids.size(); ++i)
        {
            RealBox gridloc = RealBox(grids[i],geom.CellSize(),geom.ProbLo());
            for (n = 0; n < AMREX_SPACEDIM; n++)
                os << gridloc.lo(n) << ' ' << gridloc.hi(n) << '\n';
        }
        //
        // The full relative pathname of the MultiFabs at this level.
        // The name is relative to the Header file containing this name.
        // It's the name that gets written into the Header.
        //
        if (n_data_items > 0)
        {
            std::string PathNameInHeader = sLevel;
            PathNameInHeader += BaseName;
            os << PathNameInHeader << '\n';
        }

#ifdef AMREX_USE_EB
        if (EB2::TopIndexSpaceIfPresent()) {
            // volfrac threshold for amrvis
            if (level == parent->finestLevel()) {
                for (int lev = 0; lev <= parent->finestLevel(); ++lev) {
                    os << "1.0e-6\n";
                }
            }
        }
#endif
    }
    //
    // We combine all of the multifabs -- state, derived, etc -- into one
    // multifab -- plotMF.
    int       cnt   = 0;
    const int nGrow = 0;
    MultiFab  plotMF(grids,dmap,n_data_items,nGrow,MFInfo(),Factory());
    MultiFab* this_dat = 0;
    //
    // Cull data from state variables -- use no ghost cells.
    //
    for (i = 0; i < static_cast<int>(plot_var_map.size()); i++)
    {
        int typ  = plot_var_map[i].first;
        int comp = plot_var_map[i].second;
        this_dat = &state[typ].newData();
        MultiFab::Copy(plotMF,*this_dat,comp,cnt,1,nGrow);
        cnt++;
    }

    // derived
    if (derive_names.size() > 0)
    {
        for (auto const& dname : derive_names)
        {
            derive(dname, cur_time, plotMF, cnt);
            cnt += derive_lst.get(dname)->numDerive();
        }
    }

#ifdef AMREX_USE_EB
    if (EB2::TopIndexSpaceIfPresent()) {
        plotMF.setVal(0.0, cnt, 1, nGrow);
        auto factory = static_cast<EBFArrayBoxFactory*>(m_factory.get());
        MultiFab::Copy(plotMF,factory->getVolFrac(),0,cnt,1,nGrow);
    }
#endif

    //
    // Use the Full pathname when naming the MultiFab.
    //
    std::string TheFullPath = FullPath;
    TheFullPath += BaseName;
    if (AsyncOut::UseAsyncOut()) {
        VisMF::AsyncWrite(plotMF,TheFullPath);
    } else {
        VisMF::Write(plotMF,TheFullPath,how,true);
    }

    levelDirectoryCreated = false;  // ---- now that the plotfile is finished
}